

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall
TTD::TTDIdentifierDictionary<unsigned_long,_Js::DynamicTypeHandler_*>::AddItem
          (TTDIdentifierDictionary<unsigned_long,_Js::DynamicTypeHandler_*> *this,unsigned_long id,
          DynamicTypeHandler **item)

{
  Entry *entry_00;
  Entry *entry;
  DynamicTypeHandler **item_local;
  unsigned_long id_local;
  TTDIdentifierDictionary<unsigned_long,_Js::DynamicTypeHandler_*> *this_local;
  
  if (this->m_capacity <= this->m_count << 1) {
    TTDAbort_unrecoverable_error
              ("The dictionary is being sized incorrectly and will likely have poor performance");
  }
  entry_00 = FindSlotForId<true>(this,id);
  InitializeEntry(this,entry_00,id,item);
  this->m_count = this->m_count + 1;
  return;
}

Assistant:

void AddItem(Tag id, const T& item)
        {
            TTDAssert(this->m_count * TTD_DICTIONARY_LOAD_FACTOR < this->m_capacity, "The dictionary is being sized incorrectly and will likely have poor performance");
            Entry* entry = this->FindSlotForId<true>(id);

            InitializeEntry(entry, id, item);
            this->m_count++;
        }